

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O0

bool __thiscall wallet::LegacyDataSPKM::AddWatchOnlyInMem(LegacyDataSPKM *this,CScript *dest)

{
  long lVar1;
  bool bVar2;
  mapped_type *pmVar3;
  undefined1 uVar4;
  key_type *in_RDI;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_const_iterator<CScript>,_bool> pVar5;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock28;
  CPubKey pubKey;
  CPubKey *in_stack_ffffffffffffff28;
  value_type *in_stack_ffffffffffffff30;
  set<CScript,_std::less<CScript>,_std::allocator<CScript>_> *in_stack_ffffffffffffff38;
  undefined7 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff57;
  char *in_stack_ffffffffffffff58;
  CPubKey *in_stack_ffffffffffffff60;
  FillableSigningProvider *in_stack_ffffffffffffff68;
  undefined8 local_49;
  undefined8 uStack_41;
  undefined8 local_39;
  undefined8 uStack_31;
  undefined8 local_29;
  undefined8 uStack_21;
  undefined8 local_19;
  undefined8 uStack_11;
  uchar local_9;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_ffffffffffffff28);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_ffffffffffffff68,
             (AnnotatedMixin<std::recursive_mutex> *)in_stack_ffffffffffffff60,
             in_stack_ffffffffffffff58,
             (char *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
             (int)((ulong)in_RDI >> 0x20),SUB81((ulong)in_RDI >> 0x18,0));
  pVar5 = std::set<CScript,_std::less<CScript>,_std::allocator<CScript>_>::insert
                    (in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
  uVar4 = pVar5.second;
  CPubKey::CPubKey(in_stack_ffffffffffffff28);
  bVar2 = ExtractPubKey((CScript *)in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
  if (bVar2) {
    CPubKey::GetID((CPubKey *)CONCAT17(uVar4,in_stack_ffffffffffffff50));
    pmVar3 = std::
             map<CKeyID,_CPubKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CPubKey>_>_>
             ::operator[]((map<CKeyID,_CPubKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CPubKey>_>_>
                           *)CONCAT17(uVar4,in_stack_ffffffffffffff50),in_RDI);
    pmVar3->vch[0x40] = local_9;
    *(undefined8 *)(pmVar3->vch + 0x30) = local_19;
    *(undefined8 *)(pmVar3->vch + 0x38) = uStack_11;
    *(undefined8 *)(pmVar3->vch + 0x20) = local_29;
    *(undefined8 *)(pmVar3->vch + 0x28) = uStack_21;
    *(undefined8 *)(pmVar3->vch + 0x10) = local_39;
    *(undefined8 *)(pmVar3->vch + 0x18) = uStack_31;
    *(undefined8 *)pmVar3->vch = local_49;
    *(undefined8 *)(pmVar3->vch + 8) = uStack_41;
    FillableSigningProvider::ImplicitlyLearnRelatedKeyScripts
              (in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
  }
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_ffffffffffffff28);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return true;
}

Assistant:

bool LegacyDataSPKM::AddWatchOnlyInMem(const CScript &dest)
{
    LOCK(cs_KeyStore);
    setWatchOnly.insert(dest);
    CPubKey pubKey;
    if (ExtractPubKey(dest, pubKey)) {
        mapWatchKeys[pubKey.GetID()] = pubKey;
        ImplicitlyLearnRelatedKeyScripts(pubKey);
    }
    return true;
}